

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::execShiftIm<(moira::Instr)69,(moira::Mode)11,(moira::Size)4>(Moira *this,u16 opcode)

{
  uint uVar1;
  ushort in_SI;
  Moira *in_RDI;
  int cnt;
  int dst;
  int src;
  u32 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint cnt_00;
  
  uVar1 = (int)(uint)in_SI >> 9 & 7;
  if (uVar1 == 0) {
    uVar1 = 8;
  }
  cnt_00 = uVar1;
  prefetch<4ul>((Moira *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  (*in_RDI->_vptr_Moira[0x19])(in_RDI,(ulong)(uVar1 * 2 + 4));
  readD<(moira::Size)4>
            ((Moira *)CONCAT44(uVar1,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc);
  shift<(moira::Instr)69,(moira::Size)4>(in_RDI,cnt_00,CONCAT44(uVar1,in_stack_ffffffffffffffd0));
  writeD<(moira::Size)4>
            ((Moira *)CONCAT44(uVar1,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc,
             in_stack_ffffffffffffffc8);
  return;
}

Assistant:

void
Moira::execShiftIm(u16 opcode)
{
    int src = ____xxx_________(opcode);
    int dst = _____________xxx(opcode);
    int cnt = src ? src : 8;

    prefetch<POLLIPL>();
    sync((S == Long ? 4 : 2) + 2 * cnt);

    writeD<S>(dst, shift<I,S>(cnt, readD<S>(dst)));
}